

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObjectPropertyEnumerator.cpp
# Opt level: O3

void __thiscall
Js::DynamicObjectPropertyEnumerator::Initialize
          (DynamicObjectPropertyEnumerator *this,DynamicType *type,CachedData *data,
          BigPropertyIndex initialPropertyCount)

{
  Memory::Recycler::WBSetBit((char *)&this->initialType);
  (this->initialType).ptr = type;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->initialType);
  Memory::Recycler::WBSetBit((char *)&this->cachedData);
  (this->cachedData).ptr = data;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->cachedData);
  this->initialPropertyCount = initialPropertyCount;
  return;
}

Assistant:

void DynamicObjectPropertyEnumerator::Initialize(DynamicType * type, CachedData * data, Js::BigPropertyIndex initialPropertyCount)
    {
        this->initialType = type;
        this->cachedData = data;
        this->initialPropertyCount = initialPropertyCount;
    }